

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void ycck_cmyk_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                      JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  jpeg_color_deconverter *pjVar4;
  JSAMPLE *pJVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  uint uVar14;
  JSAMPARRAY ppJVar15;
  JLONG *Cbgtab;
  JLONG *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW inptr3;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  int cr;
  int cb;
  int y;
  my_cconvert_ptr_conflict cconvert;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  
  pjVar4 = cinfo->cconvert;
  uVar3 = cinfo->output_width;
  pJVar5 = cinfo->sample_range_limit;
  p_Var6 = pjVar4[1].start_pass;
  p_Var7 = pjVar4[1].color_convert;
  p_Var8 = pjVar4[2].start_pass;
  p_Var9 = pjVar4[2].color_convert;
  cr = num_rows;
  _cb = output_buf;
  cconvert._4_4_ = input_row;
  while (cr = cr + -1, -1 < cr) {
    pJVar10 = (*input_buf)[cconvert._4_4_];
    pJVar11 = input_buf[1][cconvert._4_4_];
    pJVar12 = input_buf[2][cconvert._4_4_];
    pJVar13 = input_buf[3][cconvert._4_4_];
    cconvert._4_4_ = cconvert._4_4_ + 1;
    ppJVar15 = _cb + 1;
    inptr2 = *_cb;
    for (Cbbtab._4_4_ = 0; _cb = ppJVar15, Cbbtab._4_4_ < uVar3; Cbbtab._4_4_ = Cbbtab._4_4_ + 1) {
      uVar14 = (uint)pJVar10[Cbbtab._4_4_];
      bVar1 = pJVar11[Cbbtab._4_4_];
      bVar2 = pJVar12[Cbbtab._4_4_];
      *inptr2 = pJVar5[(int)(0xff - (uVar14 + *(int *)(p_Var6 + (long)(int)(uint)bVar2 * 4)))];
      inptr2[1] = pJVar5[(int)(0xff - (uVar14 + (int)((ulong)(*(long *)(p_Var9 + (long)(int)(uint)
                                                  bVar1 * 8) +
                                                  *(long *)(p_Var8 + (long)(int)(uint)bVar2 * 8)) >>
                                                  0x10)))];
      inptr2[2] = pJVar5[(int)(0xff - (uVar14 + *(int *)(p_Var7 + (long)(int)(uint)bVar1 * 4)))];
      inptr2[3] = pJVar13[Cbbtab._4_4_];
      inptr2 = inptr2 + 4;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycck_cmyk_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                  JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr)cinfo->cconvert;
  register int y, cb, cr;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2, inptr3;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;
  /* copy these pointers into registers if possible */
  register JSAMPLE *range_limit = cinfo->sample_range_limit;
  register int *Crrtab = cconvert->Cr_r_tab;
  register int *Cbbtab = cconvert->Cb_b_tab;
  register JLONG *Crgtab = cconvert->Cr_g_tab;
  register JLONG *Cbgtab = cconvert->Cb_g_tab;
  SHIFT_TEMPS

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    inptr3 = input_buf[3][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      y  = inptr0[col];
      cb = inptr1[col];
      cr = inptr2[col];
      /* Range-limiting is essential due to noise introduced by DCT losses. */
      outptr[0] = range_limit[MAXJSAMPLE - (y + Crrtab[cr])];   /* red */
      outptr[1] = range_limit[MAXJSAMPLE - (y +                 /* green */
                              ((int)RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr],
                                                 SCALEBITS)))];
      outptr[2] = range_limit[MAXJSAMPLE - (y + Cbbtab[cb])];   /* blue */
      /* K passes through unchanged */
      outptr[3] = inptr3[col];
      outptr += 4;
    }
  }
}